

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackPropertiesGenerator.cxx
# Opt level: O1

void __thiscall
cmCPackPropertiesGenerator::cmCPackPropertiesGenerator
          (cmCPackPropertiesGenerator *this,cmLocalGenerator *lg,cmInstalledFile *installedFile,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations)

{
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CPACK_BUILD_CONFIG","");
  cmScriptGenerator::cmScriptGenerator(&this->super_cmScriptGenerator,&local_50,configurations);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_cmScriptGenerator)._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmScriptGenerator_006932a0;
  this->LG = lg;
  this->InstalledFile = installedFile;
  (this->super_cmScriptGenerator).ActionsPerConfig = true;
  return;
}

Assistant:

cmCPackPropertiesGenerator::cmCPackPropertiesGenerator(
  cmLocalGenerator* lg, cmInstalledFile const& installedFile,
  std::vector<std::string> const& configurations)
  : cmScriptGenerator("CPACK_BUILD_CONFIG", configurations)
  , LG(lg)
  , InstalledFile(installedFile)
{
  this->ActionsPerConfig = true;
}